

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char,char_const*&,char_const(&)[7],char_const*,char_const(&)[18],char_const*&,char_const(&)[7]>
          (Exception *this,char **args,char *args_1,int *args_2,char *args_3,char **args_4,
          char (*args_5) [7],char **args_6,char (*args_7) [18],char **args_8,char (*args_9) [7])

{
  ostringstream oss;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  SetWhat<char_const*&,char,int&,char,char_const*&,char_const(&)[7],char_const*,char_const(&)[18],char_const*&,char_const(&)[7]>
            (this,(ostringstream *)local_1a8,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,
             args_8,args_9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }